

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1477::run(TestCase1477 *this)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder builder_00;
  WirePointer *pWVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Reader oldRoot;
  Builder root;
  Reader oldSub;
  Reader oldSub2;
  MallocMessageBuilder builder;
  PointerBuilder local_218;
  long lStack_200;
  undefined4 local_1f8;
  ushort uStack_1f4;
  undefined2 uStack_1f2;
  int iStack_1f0;
  undefined4 uStack_1ec;
  StructBuilder local_1e8;
  StructReader local_1c0;
  undefined1 local_190 [64];
  undefined8 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c0,&local_f8.super_MessageBuilder);
  local_218.pointer = (WirePointer *)local_1c0.data;
  local_218.segment = (SegmentBuilder *)local_1c0.segment;
  local_218.capTable = (CapTableBuilder *)local_1c0.capTable;
  PointerBuilder::initStruct(&local_1e8,&local_218,(StructSize)0x140006);
  builder_00._builder.segment._4_4_ = in_stack_fffffffffffffed4;
  builder_00._builder.segment._0_4_ = in_stack_fffffffffffffed0;
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffed8;
  builder_00._builder.data = (void *)in_stack_fffffffffffffee0;
  builder_00._builder.pointers._0_4_ = in_stack_fffffffffffffee8;
  builder_00._builder.pointers._4_4_ = in_stack_fffffffffffffeec;
  builder_00._builder.dataSize = in_stack_fffffffffffffef0;
  builder_00._builder._36_4_ = in_stack_fffffffffffffef4;
  initTestMessage(builder_00);
  StructBuilder::asReader(&local_1e8);
  reader._reader.pointerCount = uStack_1f4;
  reader._reader.dataSize = local_1f8;
  reader._reader._38_2_ = uStack_1f2;
  reader._reader._44_4_ = uStack_1ec;
  reader._reader.nestingLimit = iStack_1f0;
  reader._reader.capTable = &(local_218.capTable)->super_CapTableReader;
  reader._reader.segment = &(local_218.segment)->super_SegmentReader;
  reader._reader.data = local_218.pointer;
  reader._reader.pointers = (WirePointer *)lStack_200;
  checkTestMessage(reader);
  pWVar1 = (WirePointer *)(lStack_200 + 0x10);
  if (uStack_1f4 < 3) {
    pWVar1 = (WirePointer *)0x0;
  }
  if (uStack_1f4 < 3) {
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    iStack_1f0 = 0x7fffffff;
  }
  else {
    uVar2 = local_218.segment._0_4_;
    uVar3 = local_218.segment._4_4_;
    uVar4 = local_218.capTable._0_4_;
    uVar5 = local_218.capTable._4_4_;
  }
  PointerReader::getStruct(&local_1c0,(PointerReader *)&stack0xfffffffffffffeb8,(word *)0x0);
  PointerReader::getList
            ((ListReader *)local_190,(PointerReader *)&stack0xfffffffffffffee8,INLINE_COMPOSITE,
             (word *)0x0);
  ListReader::getStructElement((StructReader *)&stack0xfffffffffffffeb8,(ListReader *)local_190,0);
  MessageBuilder::getRootInternal((Builder *)(local_190 + 0x30),&local_f8.super_MessageBuilder);
  PointerBuilder::initStruct
            ((StructBuilder *)local_190,(PointerBuilder *)&stack0xfffffffffffffee8,
             (StructSize)0x140006);
  local_1e8.segment = (SegmentBuilder *)local_190._0_8_;
  local_1e8.capTable = (CapTableBuilder *)local_190._8_8_;
  local_1e8.data = (void *)local_190._16_8_;
  local_1e8.pointers = (WirePointer *)local_190._24_8_;
  local_1e8.dataSize = local_190._32_4_;
  local_1e8.pointerCount = local_190._36_2_;
  local_1e8._38_2_ = local_190._38_2_;
  reader_00._reader.capTable._0_4_ = uVar2;
  reader_00._reader.segment = (SegmentReader *)in_stack_fffffffffffffeb0;
  reader_00._reader.capTable._4_4_ = uVar3;
  reader_00._reader.data._0_4_ = uVar4;
  reader_00._reader.data._4_4_ = uVar5;
  reader_00._reader.pointers = pWVar1;
  reader_00._reader.dataSize = iStack_1f0;
  reader_00._reader.pointerCount = (short)in_stack_fffffffffffffed4;
  reader_00._reader._38_2_ = SUB42(in_stack_fffffffffffffed4,2);
  reader_00._reader.nestingLimit = (StructDataBitCount)in_stack_fffffffffffffed8;
  reader_00._reader._44_2_ = SUB82(in_stack_fffffffffffffed8,4);
  reader_00._reader._46_2_ = SUB82(in_stack_fffffffffffffed8,6);
  checkTestMessageAllZero(reader_00);
  reader_01._reader.capTable._0_4_ = uVar2;
  reader_01._reader.segment = (SegmentReader *)in_stack_fffffffffffffeb0;
  reader_01._reader.capTable._4_4_ = uVar3;
  reader_01._reader.data._0_4_ = uVar4;
  reader_01._reader.data._4_4_ = uVar5;
  reader_01._reader.pointers = pWVar1;
  reader_01._reader.dataSize = iStack_1f0;
  reader_01._reader.pointerCount = (short)in_stack_fffffffffffffed4;
  reader_01._reader._38_2_ = SUB42(in_stack_fffffffffffffed4,2);
  reader_01._reader.nestingLimit = (StructDataBitCount)in_stack_fffffffffffffed8;
  reader_01._reader._44_2_ = SUB82(in_stack_fffffffffffffed8,4);
  reader_01._reader._46_2_ = SUB82(in_stack_fffffffffffffed8,6);
  checkTestMessageAllZero(reader_01);
  reader_02._reader.capTable._0_4_ = uVar2;
  reader_02._reader.segment = (SegmentReader *)in_stack_fffffffffffffeb0;
  reader_02._reader.capTable._4_4_ = uVar3;
  reader_02._reader.data._0_4_ = uVar4;
  reader_02._reader.data._4_4_ = uVar5;
  reader_02._reader.pointers = pWVar1;
  reader_02._reader.dataSize = iStack_1f0;
  reader_02._reader.pointerCount = (short)in_stack_fffffffffffffed4;
  reader_02._reader._38_2_ = SUB42(in_stack_fffffffffffffed4,2);
  reader_02._reader.nestingLimit = (StructDataBitCount)in_stack_fffffffffffffed8;
  reader_02._reader._44_2_ = SUB82(in_stack_fffffffffffffed8,4);
  reader_02._reader._46_2_ = SUB82(in_stack_fffffffffffffed8,6);
  checkTestMessageAllZero(reader_02);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Encoding, ZeroOldObject) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  auto oldRoot = root.asReader();
  checkTestMessage(oldRoot);

  auto oldSub = oldRoot.getStructField();
  auto oldSub2 = oldRoot.getStructList()[0];

  root = builder.initRoot<TestAllTypes>();
  checkTestMessageAllZero(oldRoot);
  checkTestMessageAllZero(oldSub);
  checkTestMessageAllZero(oldSub2);
}